

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

void tgt_reset(opj_tgt_tree_t *p_tree)

{
  opj_tgt_node_t *l_current_node;
  OPJ_UINT32 i;
  opj_tgt_tree_t *p_tree_local;
  
  if (p_tree != (opj_tgt_tree_t *)0x0) {
    l_current_node = p_tree->nodes;
    for (i = 0; i < p_tree->numnodes; i = i + 1) {
      l_current_node->value = 999;
      l_current_node->low = 0;
      l_current_node->known = 0;
      l_current_node = l_current_node + 1;
    }
  }
  return;
}

Assistant:

void tgt_reset(opj_tgt_tree_t *p_tree) {
	OPJ_UINT32 i;
	opj_tgt_node_t * l_current_node = 00;;

	if (! p_tree) {
		return;
	}

	l_current_node = p_tree->nodes;
	for	(i = 0; i < p_tree->numnodes; ++i)
	{
		l_current_node->value = 999;
		l_current_node->low = 0;
		l_current_node->known = 0;
		++l_current_node;
	}
}